

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O0

istream * operator>>(istream *stream,TxaHeader *header)

{
  int iVar1;
  istream *in_RDI;
  int version;
  TxaHeader *in_stack_000000b8;
  istream *in_stack_000000c0;
  TxaHeader *in_stack_000000c8;
  istream *in_stack_000000d0;
  
  iVar1 = detectSwitch((istream *)header);
  if (iVar1 < 0) {
    readTxa<TxaHeaderPS3>(in_stack_000000d0,in_stack_000000c8);
  }
  else {
    readTxa<TxaHeaderSwitch>(in_stack_000000c0,in_stack_000000b8);
  }
  return in_RDI;
}

Assistant:

std::istream& operator>>(std::istream& stream, TxaHeader& header) {
	int version = detectSwitch(stream);
	if (version < 0) { // PS3
		readTxa<TxaHeaderPS3>(stream, header);
	} else { // Switch
		readTxa<TxaHeaderSwitch>(stream, header);
	}
	return stream;
}